

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmdLine.h
# Opt level: O0

void __thiscall TCLAP::CmdLine::~CmdLine(CmdLine *this)

{
  long *plVar1;
  list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *in_RDI;
  
  (in_RDI->super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>)._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&PTR__CmdLine_001707c8;
  ClearContainer<std::__cxx11::list<TCLAP::Arg*,std::allocator<TCLAP::Arg*>>>(in_RDI);
  ClearContainer<std::__cxx11::list<TCLAP::Visitor*,std::allocator<TCLAP::Visitor*>>>
            ((list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_> *)in_RDI);
  if (((ulong)in_RDI[9].super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
              _M_node.super__List_node_base._M_next & 0x100) == 0) {
    plVar1 = (long *)in_RDI[8].super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl
                     ._M_node._M_size;
    if (plVar1 != (long *)0x0) {
      (**(code **)(*plVar1 + 8))();
    }
    in_RDI[8].super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl._M_node._M_size
         = 0;
  }
  std::__cxx11::list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_>::~list
            ((list<TCLAP::Visitor_*,_std::allocator<TCLAP::Visitor_*>_> *)0x1375dd);
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::~list
            ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)0x1375ee);
  XorHandler::~XorHandler((XorHandler *)0x1375ff);
  std::__cxx11::string::~string((string *)(in_RDI + 4));
  std::__cxx11::string::~string
            ((string *)
             &in_RDI[2].super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
              _M_node._M_size);
  std::__cxx11::string::~string
            ((string *)
             &in_RDI[1].super__List_base<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>._M_impl.
              _M_node.super__List_node_base._M_prev);
  std::__cxx11::list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_>::~list
            ((list<TCLAP::Arg_*,_std::allocator<TCLAP::Arg_*>_> *)0x137637);
  CmdLineInterface::~CmdLineInterface((CmdLineInterface *)in_RDI);
  return;
}

Assistant:

inline CmdLine::~CmdLine()
{
	ClearContainer(_argDeleteOnExitList);
	ClearContainer(_visitorDeleteOnExitList);

	if ( !_userSetOutput ) {
		delete _output;
		_output = 0;
	}
}